

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisRegular.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::GridAxisRegular::GridAxisRegular(GridAxisRegular *this)

{
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__GridAxisRegular_0021fcc8;
  this->m_f64DomainInitialXi = 0.0;
  this->m_f64DomainFinalXi = 0.0;
  this->m_ui16DomainPointsXi = 0;
  this->m_ui8InterleafFactor = '\0';
  this->m_ui8AxisType = '\0';
  this->m_ui16NumPoints = 0;
  this->m_ui16InitialIndex = 0;
  return;
}

Assistant:

GridAxisRegular::GridAxisRegular() :
    m_f64DomainInitialXi( 0 ),
    m_f64DomainFinalXi( 0 ),
    m_ui16DomainPointsXi( 0 ),
    m_ui8InterleafFactor( 0 ),
    m_ui8AxisType( 0 ),
    m_ui16NumPoints( 0 ),
    m_ui16InitialIndex( 0 )
{
}